

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp1_fast_iVar5(uint *pInOut,int nWords,int *pDifStart)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  
  if (0 < nWords) {
    puVar1 = pInOut + (nWords * 2 - 2);
    iVar3 = nWords * 2;
    do {
      iVar2 = -(uint)(*puVar1 < puVar1[-1]);
      if (puVar1[-1] < *puVar1) {
        iVar2 = 1;
      }
      if (iVar2 != 0) {
        if (iVar2 == -1) {
          iVar2 = 1;
        }
        else {
          iVar2 = 2;
        }
        goto LAB_005ded77;
      }
      iVar2 = iVar3 + -2;
      puVar1 = puVar1 + -4;
      iVar3 = iVar3 + -4;
    } while (3 < iVar2);
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_005ded77:
  *pDifStart = iVar3;
  return iVar2;
}

Assistant:

int minTemp1_fast_iVar5(unsigned* pInOut, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp1_fast_iVar5\n");
    for(i=(nWords)*2 - 2; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i],pInOut[i-1]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+2;
            return 1;
        }
        else
        {
            *pDifStart = i+2;
            return 2;
        }
    }
    *pDifStart=0;
    return 1;
}